

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O3

void __thiscall
cmFindLibraryCommand::AddArchitecturePath
          (cmFindLibraryCommand *this,string *dir,size_type start_pos,char *suffix,bool fresh)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  size_t sVar5;
  string lib;
  string libX;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  lVar4 = std::__cxx11::string::find((char *)dir,0x567147,start_pos);
  if (lVar4 != -1) {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)dir);
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_90);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_90._M_dataplus._M_p,
               local_90._M_dataplus._M_p + local_90._M_string_length);
    std::__cxx11::string::append((char *)&local_70);
    bVar3 = cmsys::SystemTools::FileIsDirectory(&local_70);
    if (bVar2 && bVar3) {
      bVar3 = cmLibDirsLinked(&local_70,&local_90);
      if (!bVar3) {
LAB_002a962a:
        std::__cxx11::string::substr((ulong)local_50,(ulong)dir);
        std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        sVar5 = strlen(suffix);
        AddArchitecturePath(this,&local_70,lVar4 + sVar5 + 4,suffix,true);
      }
    }
    else if (bVar3) goto LAB_002a962a;
    if (bVar2) {
      AddArchitecturePath(this,dir,lVar4 + 4,suffix,false);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if (!fresh) {
    return;
  }
  bVar2 = cmsys::SystemTools::FileIsDirectory(dir);
  pcVar1 = (dir->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + dir->_M_string_length);
  std::__cxx11::string::append((char *)&local_90);
  bVar3 = cmsys::SystemTools::FileIsDirectory(&local_90);
  if (bVar2 && bVar3) {
    bVar3 = cmLibDirsLinked(&local_90,dir);
    if (bVar3) goto LAB_002a977b;
  }
  else if (!bVar3) goto LAB_002a977b;
  std::__cxx11::string::append((char *)&local_90);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_cmFindBase).super_cmFindCommon.SearchPaths,&local_90);
LAB_002a977b:
  if (bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->super_cmFindBase).super_cmFindCommon.SearchPaths,dir);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFindLibraryCommand::AddArchitecturePath(
  std::string const& dir, std::string::size_type start_pos, const char* suffix,
  bool fresh)
{
  std::string::size_type pos = dir.find("lib/", start_pos);

  if (pos != std::string::npos) {
    // Check for "lib".
    std::string lib = dir.substr(0, pos + 3);
    bool use_lib = cmSystemTools::FileIsDirectory(lib);

    // Check for "lib<suffix>" and use it first.
    std::string libX = lib + suffix;
    bool use_libX = cmSystemTools::FileIsDirectory(libX);

    // Avoid copies of the same directory due to symlinks.
    if (use_libX && use_lib && cmLibDirsLinked(libX, lib)) {
      use_libX = false;
    }

    if (use_libX) {
      libX += dir.substr(pos + 3);
      std::string::size_type libX_pos = pos + 3 + strlen(suffix) + 1;
      this->AddArchitecturePath(libX, libX_pos, suffix);
    }

    if (use_lib) {
      this->AddArchitecturePath(dir, pos + 3 + 1, suffix, false);
    }
  }

  if (fresh) {
    // Check for the original unchanged path.
    bool use_dir = cmSystemTools::FileIsDirectory(dir);

    // Check for <dir><suffix>/ and use it first.
    std::string dirX = dir + suffix;
    bool use_dirX = cmSystemTools::FileIsDirectory(dirX);

    // Avoid copies of the same directory due to symlinks.
    if (use_dirX && use_dir && cmLibDirsLinked(dirX, dir)) {
      use_dirX = false;
    }

    if (use_dirX) {
      dirX += "/";
      this->SearchPaths.push_back(std::move(dirX));
    }

    if (use_dir) {
      this->SearchPaths.push_back(dir);
    }
  }
}